

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall cs222::Parser::parseOperation(Parser *this,string *token,string *operation)

{
  bool bVar1;
  char *pcVar2;
  bool local_a9;
  allocator local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  byte local_41;
  string local_40;
  string *local_20;
  string *operation_local;
  string *token_local;
  Parser *this_local;
  
  local_20 = operation;
  operation_local = token;
  token_local = (string *)this;
  bVar1 = isDirective(token);
  if ((bVar1) || (bVar1 = isOperation(operation_local), bVar1)) {
    std::__cxx11::string::operator=((string *)local_20,(string *)operation_local);
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)operation_local);
    local_41 = 0;
    local_a9 = false;
    if (*pcVar2 == '+') {
      std::__cxx11::string::substr((ulong)&local_40,(ulong)operation_local);
      local_41 = 1;
      local_a9 = isOperation(&local_40);
    }
    if ((local_41 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_40);
    }
    if (local_a9 == false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_98,"not a valid directive or operation: ",&local_99);
      std::operator+(&local_78,&local_98,operation_local);
      throwError(this,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
    }
    else {
      std::__cxx11::string::operator=((string *)local_20,(string *)operation_local);
      std::bitset<6UL>::set(&this->flags,0,true);
    }
  }
  return;
}

Assistant:

void Parser::parseOperation(
            const std::string& token, std::string& operation)
    {
        if (isDirective(token) || isOperation(token))
        {
            operation = token;
        }
        else if (token[0] == '+' && isOperation(token.substr(1)))
        {
            operation = token;
            flags.set(Instruction::FLAG_EXTENDED);
        }
        else
        {
            throwError(std::string("not a valid directive or operation: ") + token);
        }
    }